

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocumentUtil.h
# Opt level: O1

BlendShape *
Assimp::FBX::Util::ProcessSimpleConnection<Assimp::FBX::BlendShape>
          (Connection *con,bool is_object_property_conn,char *name,Element *element,
          char **propNameOut)

{
  size_type sVar1;
  Object *pOVar2;
  BlendShape *pBVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  undefined7 in_register_00000031;
  allocator<char> local_79;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  sVar1 = (con->prop)._M_string_length;
  if ((int)CONCAT71(in_register_00000031,is_object_property_conn) == 0) {
joined_r0x0060e466:
    if (sVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_79);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x70f39e);
      local_78 = &local_68;
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_68 = *plVar6;
        lStack_60 = plVar5[3];
      }
      else {
        local_68 = *plVar6;
        local_78 = (long *)*plVar5;
      }
      local_70 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58.field_2._8_8_ = plVar5[3];
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_58._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DOMWarning(&local_58,element);
      goto LAB_0060e6ff;
    }
  }
  else {
    if (sVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_79);
      puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x70f39e);
      local_78 = &local_68;
      plVar5 = puVar4 + 2;
      if ((long *)*puVar4 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = puVar4[3];
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*puVar4;
      }
      local_70 = puVar4[1];
      *puVar4 = plVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58.field_2._8_8_ = plVar5[3];
      }
      else {
        local_58.field_2._M_allocated_capacity = *psVar7;
        local_58._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_58._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DOMWarning(&local_58,element);
      goto LAB_0060e6ff;
    }
    if (!is_object_property_conn) {
      sVar1 = (con->prop)._M_string_length;
      goto joined_r0x0060e466;
    }
  }
  if (is_object_property_conn && propNameOut != (char **)0x0) {
    *propNameOut = (con->prop)._M_dataplus._M_p;
  }
  pOVar2 = Connection::SourceObject(con);
  if (pOVar2 != (Object *)0x0) {
    pBVar3 = (BlendShape *)__dynamic_cast(pOVar2,&Object::typeinfo,&BlendShape::typeinfo,0);
    return pBVar3;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name,&local_79);
  puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x70f417);
  local_78 = &local_68;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_68 = *plVar5;
    lStack_60 = puVar4[3];
  }
  else {
    local_68 = *plVar5;
    local_78 = (long *)*puVar4;
  }
  local_70 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_58.field_2._M_allocated_capacity = *psVar7;
    local_58.field_2._8_8_ = plVar5[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar7;
    local_58._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_58._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  DOMWarning(&local_58,element);
LAB_0060e6ff:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return (BlendShape *)0x0;
}

Assistant:

inline
const T* ProcessSimpleConnection(const Connection& con,
    bool is_object_property_conn,
    const char* name,
    const Element& element,
    const char** propNameOut = nullptr)
{
    if (is_object_property_conn && !con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-object connection, ignoring",
            &element
            );
        return nullptr;
    }
    else if (!is_object_property_conn && con.PropertyName().length()) {
        DOMWarning("expected incoming " + std::string(name) +
            " link to be an object-property connection, ignoring",
            &element
            );
        return nullptr;
    }

    if(is_object_property_conn && propNameOut) {
        // note: this is ok, the return value of PropertyValue() is guaranteed to
        // remain valid and unchanged as long as the document exists.
        *propNameOut = con.PropertyName().c_str();
    }

    const Object* const ob = con.SourceObject();
    if(!ob) {
        DOMWarning("failed to read source object for incoming " + std::string(name) +
            " link, ignoring",
            &element);
        return nullptr;
    }

    return dynamic_cast<const T*>(ob);
}